

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O1

BYTE * EmitLEB128(BYTE *pc,uint value)

{
  bool bVar1;
  ulong uVar2;
  
  uVar2 = (ulong)value;
  do {
    uVar2 = uVar2 >> 7;
    *pc = (0x7f < value) << 7 | (byte)value & 0x7f;
    pc = pc + 1;
    bVar1 = 0x7f < value;
    value = (uint)uVar2;
  } while (bVar1);
  return pc;
}

Assistant:

BYTE* EmitLEB128(BYTE* pc, unsigned value)
{
    do
    {
        BYTE b = value & 0x7F; // low order 7 bits
        value >>= 7;

        if (value)  // more bytes to come
        {
            b |= 0x80;
        }

        *pc++ = b;
    }
    while (value != 0);

    return pc;
}